

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O0

boolean m_slips_free(monst *mdef,attack *mattk)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *local_48;
  obj *local_28;
  obj *obj;
  attack *mattk_local;
  monst *mdef_local;
  
  if (mattk->adtyp == ' ') {
    local_28 = which_armor(mdef,4);
  }
  else {
    local_28 = which_armor(mdef,2);
    if (local_28 == (obj *)0x0) {
      local_28 = which_armor(mdef,1);
    }
    if (local_28 == (obj *)0x0) {
      local_28 = which_armor(mdef,0x40);
    }
  }
  if (((local_28 == (obj *)0x0) ||
      (((*(uint *)&local_28->field_0x4a >> 0x14 & 1) == 0 && (local_28->otyp != 0x80)))) ||
     (((*(uint *)&local_28->field_0x4a & 1) != 0 && (iVar1 = rn2(3), iVar1 == 0)))) {
    mdef_local._7_1_ = '\0';
  }
  else {
    pcVar2 = "grab, but cannot hold onto";
    if (mattk->adtyp == '\x1c') {
      pcVar2 = "slip off of";
    }
    pcVar3 = mon_nam(mdef);
    pcVar3 = s_suffix(pcVar3);
    pcVar4 = "slippery";
    if ((*(uint *)&local_28->field_0x4a >> 0x14 & 1) != 0) {
      pcVar4 = "greased";
    }
    if (((*(uint *)&local_28->field_0x4a >> 0x14 & 1) == 0) &&
       ((objects[local_28->otyp].field_0x10 & 1) == 0)) {
      local_48 = cloak_simple_name(local_28);
    }
    else {
      local_48 = xname(local_28);
    }
    pline("You %s %s %s %s!",pcVar2,pcVar3,pcVar4,local_48);
    if (((*(uint *)&local_28->field_0x4a >> 0x14 & 1) != 0) && (iVar1 = rn2(2), iVar1 == 0)) {
      pline("The grease wears off.");
      *(uint *)&local_28->field_0x4a = *(uint *)&local_28->field_0x4a & 0xffefffff;
    }
    mdef_local._7_1_ = '\x01';
  }
  return mdef_local._7_1_;
}

Assistant:

static boolean m_slips_free(struct monst *mdef, const struct attack *mattk)
{
	struct obj *obj;

	if (mattk->adtyp == AD_DRIN) {
	    /* intelligence drain attacks the head */
	    obj = which_armor(mdef, W_ARMH);
	} else {
	    /* grabbing attacks the body */
	    obj = which_armor(mdef, W_ARMC);		/* cloak */
	    if (!obj) obj = which_armor(mdef, W_ARM);	/* suit */
	    if (!obj) obj = which_armor(mdef, W_ARMU);	/* shirt */
	}

	/* if your cloak/armor is greased, monster slips off; this
	   protection might fail (33% chance) when the armor is cursed */
	if (obj && (obj->greased || obj->otyp == OILSKIN_CLOAK) &&
		(!obj->cursed || rn2(3))) {
	    pline("You %s %s %s %s!",
		mattk->adtyp == AD_WRAP ?
			"slip off of" : "grab, but cannot hold onto",
		s_suffix(mon_nam(mdef)),
		obj->greased ? "greased" : "slippery",
		/* avoid "slippery slippery cloak"
		   for undiscovered oilskin cloak */
		(obj->greased || objects[obj->otyp].oc_name_known) ?
			xname(obj) : cloak_simple_name(obj));

	    if (obj->greased && !rn2(2)) {
		pline("The grease wears off.");
		obj->greased = 0;
	    }
	    return TRUE;
	}
	return FALSE;
}